

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O2

void unpackforblock21(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t *puVar13;
  uint uVar14;
  
  puVar1 = (ulong *)*pw;
  uVar2 = *puVar1;
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  uVar6 = puVar1[4];
  uVar7 = puVar1[5];
  uVar8 = puVar1[6];
  uVar9 = puVar1[7];
  uVar10 = puVar1[8];
  uVar11 = puVar1[9];
  uVar12 = puVar1[10];
  puVar13 = *pout;
  *pw = (uint8_t *)((long)puVar1 + 0x54);
  *puVar13 = ((uint)uVar2 & 0x1fffff) + base;
  puVar13[1] = ((uint)(uVar2 >> 0x15) & 0x1fffff) + base;
  uVar14 = (uint)(uVar2 >> 0x20);
  puVar13[2] = (uVar14 >> 10 & 0x1fffff) + base;
  puVar13[3] = ((uint)(uVar3 << 1) & 0x1fffff | uVar14 >> 0x1f) + base;
  puVar13[4] = ((uint)(uVar3 >> 0x14) & 0x1fffff) + base;
  uVar14 = (uint)(uVar3 >> 0x20);
  puVar13[5] = (uVar14 >> 9 & 0x1fffff) + base;
  puVar13[6] = ((uint)(uVar4 << 2) & 0x1fffff | uVar14 >> 0x1e) + base;
  puVar13[7] = ((uint)(uVar4 >> 0x13) & 0x1fffff) + base;
  uVar14 = (uint)(uVar4 >> 0x20);
  puVar13[8] = (uVar14 >> 8 & 0x1fffff) + base;
  puVar13[9] = ((uint)(uVar5 << 3) & 0x1fffff | uVar14 >> 0x1d) + base;
  uVar14 = (uint)(uVar5 >> 0x20);
  puVar13[10] = ((uint)(uVar5 >> 0x12) & 0x1fffff) + base;
  puVar13[0xb] = (uVar14 >> 7 & 0x1fffff) + base;
  puVar13[0xc] = ((uint)(uVar6 << 4) & 0x1fffff | uVar14 >> 0x1c) + base;
  puVar13[0xd] = ((uint)(uVar6 >> 0x11) & 0x1fffff) + base;
  uVar14 = (uint)(uVar6 >> 0x20);
  puVar13[0xe] = (uVar14 >> 6 & 0x1fffff) + base;
  puVar13[0xf] = ((uint)(uVar7 << 5) & 0x1fffff | uVar14 >> 0x1b) + base;
  puVar13[0x10] = ((uint)(uVar7 >> 0x10) & 0x1fffff) + base;
  uVar14 = (uint)(uVar7 >> 0x20);
  puVar13[0x11] = (uVar14 >> 5 & 0x1fffff) + base;
  puVar13[0x12] = ((uint)(uVar8 << 6) & 0x1fffff | uVar14 >> 0x1a) + base;
  puVar13[0x13] = ((uint)(uVar8 >> 0xf) & 0x1fffff) + base;
  uVar14 = (uint)(uVar8 >> 0x20);
  puVar13[0x14] = (uVar14 >> 4 & 0x1fffff) + base;
  puVar13[0x15] = ((uint)(uVar9 << 7) & 0x1fffff | uVar14 >> 0x19) + base;
  puVar13[0x16] = ((uint)(uVar9 >> 0xe) & 0x1fffff) + base;
  puVar13[0x17] = ((uint)(uVar9 >> 0x23) & 0x1fffff) + base;
  puVar13[0x18] = ((uint)(uVar10 << 8) & 0x1fffff | (uint)(byte)(uVar9 >> 0x38)) + base;
  puVar13[0x19] = ((uint)(uVar10 >> 0xd) & 0x1fffff) + base;
  uVar14 = (uint)(uVar10 >> 0x20);
  puVar13[0x1a] = (uVar14 >> 2 & 0x1fffff) + base;
  puVar13[0x1b] = ((uint)(uVar11 << 9) & 0x1fffff | uVar14 >> 0x17) + base;
  puVar13[0x1c] = ((uint)(uVar11 >> 0xc) & 0x1fffff) + base;
  uVar14 = (uint)(uVar11 >> 0x20);
  puVar13[0x1d] = (uVar14 >> 1 & 0x1fffff) + base;
  puVar13[0x1e] = ((uint)(uVar12 << 10) & 0x1fffff | uVar14 >> 0x16) + base;
  puVar13[0x1f] = ((uint)(uVar12 >> 0xb) & 0x1fffff) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock21(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(2097151);
  /* we are going to access  11 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  *pw += 84; /* we used up 84 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 21) & mask);
  out[2] = base + (uint32_t)((w0 >> 42) & mask);
  out[3] = base + (uint32_t)(((w0 >> 63) | (w1 << 1)) & mask);
  out[4] = base + (uint32_t)((w1 >> 20) & mask);
  out[5] = base + (uint32_t)((w1 >> 41) & mask);
  out[6] = base + (uint32_t)(((w1 >> 62) | (w2 << 2)) & mask);
  out[7] = base + (uint32_t)((w2 >> 19) & mask);
  out[8] = base + (uint32_t)((w2 >> 40) & mask);
  out[9] = base + (uint32_t)(((w2 >> 61) | (w3 << 3)) & mask);
  out[10] = base + (uint32_t)((w3 >> 18) & mask);
  out[11] = base + (uint32_t)((w3 >> 39) & mask);
  out[12] = base + (uint32_t)(((w3 >> 60) | (w4 << 4)) & mask);
  out[13] = base + (uint32_t)((w4 >> 17) & mask);
  out[14] = base + (uint32_t)((w4 >> 38) & mask);
  out[15] = base + (uint32_t)(((w4 >> 59) | (w5 << 5)) & mask);
  out[16] = base + (uint32_t)((w5 >> 16) & mask);
  out[17] = base + (uint32_t)((w5 >> 37) & mask);
  out[18] = base + (uint32_t)(((w5 >> 58) | (w6 << 6)) & mask);
  out[19] = base + (uint32_t)((w6 >> 15) & mask);
  out[20] = base + (uint32_t)((w6 >> 36) & mask);
  out[21] = base + (uint32_t)(((w6 >> 57) | (w7 << 7)) & mask);
  out[22] = base + (uint32_t)((w7 >> 14) & mask);
  out[23] = base + (uint32_t)((w7 >> 35) & mask);
  out[24] = base + (uint32_t)(((w7 >> 56) | (w8 << 8)) & mask);
  out[25] = base + (uint32_t)((w8 >> 13) & mask);
  out[26] = base + (uint32_t)((w8 >> 34) & mask);
  out[27] = base + (uint32_t)(((w8 >> 55) | (w9 << 9)) & mask);
  out[28] = base + (uint32_t)((w9 >> 12) & mask);
  out[29] = base + (uint32_t)((w9 >> 33) & mask);
  out[30] = base + (uint32_t)(((w9 >> 54) | (w10 << 10)) & mask);
  out[31] = base + (uint32_t)((w10 >> 11) & mask);
  *pout += 32; /* we wrote 32 32-bit integers */
}